

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

void amrex::ParmParse::Initialize(int argc,char **argv,char *parfile)

{
  int in_ECX;
  __off64_t *in_R8;
  size_t in_R9;
  ulong uVar1;
  string argstr;
  pointer local_48;
  list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> arg_table;
  
  if ((anonymous_namespace)::(anonymous_namespace)::initialized == '\x01') {
    Error_host("ParmParse::Initialize(): already initialized!");
  }
  if (parfile != (char *)0x0) {
    anon_unknown_12::read_file
              (parfile,(list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
                        *)&(anonymous_namespace)::g_table_abi_cxx11_);
  }
  if (0 < argc) {
    argstr._M_dataplus._M_p = (pointer)&argstr.field_2;
    argstr._M_string_length = 0;
    argstr.field_2._M_local_buf[0] = '\0';
    for (uVar1 = 0; (uint)argc != uVar1; uVar1 = uVar1 + 1) {
      std::__cxx11::string::append((char *)&argstr);
      std::__cxx11::string::push_back((char)&argstr);
    }
    arg_table.
    super__List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&arg_table;
    arg_table.
    super__List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>.
    _M_impl._M_node._M_size = 0;
    local_48 = argstr._M_dataplus._M_p;
    arg_table.
    super__List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>.
    _M_impl._M_node.super__List_node_base._M_prev =
         arg_table.
         super__List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>.
         _M_impl._M_node.super__List_node_base._M_next;
    anon_unknown_12::bldTable
              (&local_48,
               (list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)
               arg_table.
               super__List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
               ._M_impl._M_node.super__List_node_base._M_next);
    std::__cxx11::list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::
    splice((list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)
           &(anonymous_namespace)::g_table_abi_cxx11_,0x7dd720,
           (__off64_t *)
           &arg_table.
            super__List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
           ,in_ECX,in_R8,in_R9,(uint)argstr._M_dataplus._M_p);
    std::__cxx11::
    _List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::_M_clear
              (&arg_table.
                super__List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
              );
    std::__cxx11::string::~string((string *)&argstr);
  }
  (anonymous_namespace)::(anonymous_namespace)::initialized = 1;
  ExecOnFinalize((PTR_TO_VOID_FUNC)0x4d5c8c);
  return;
}

Assistant:

void
ParmParse::Initialize (int         argc,
                       char**      argv,
                       const char* parfile)
{
    if ( initialized )
    {
        amrex::Error("ParmParse::Initialize(): already initialized!");
    }

    ppinit(argc, argv, parfile, g_table);

    amrex::ExecOnFinalize(ParmParse::Finalize);
}